

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseImpl.h
# Opt level: O0

void Eigen::internal::
     compute_inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *matrix,Matrix<double,_3,_3,_0,_3,_3> *result)

{
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_a8;
  Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> local_60;
  Matrix<double,3,3,0,3,3> *local_18;
  Matrix<double,_3,_3,_0,_3,_3> *result_local;
  Matrix<double,__1,__1,_0,__1,__1> *matrix_local;
  
  local_18 = (Matrix<double,3,3,0,3,3> *)result;
  result_local = (Matrix<double,_3,_3,_0,_3,_3> *)matrix;
  MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::partialPivLu
            (&local_a8,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse(&local_60,&local_a8);
  Matrix<double,3,3,0,3,3>::operator=
            (local_18,(DenseBase<Eigen::Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_60);
  Inverse<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::~Inverse(&local_60);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU(&local_a8);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const MatrixType& matrix, ResultType& result)
  {
    result = matrix.partialPivLu().inverse();
  }